

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O2

void destroyPath(Path *path)

{
  TileNode *__ptr;
  uint uVar1;
  TileNode *pTVar2;
  int i;
  uint uVar3;
  
  uVar1 = path->count;
  uVar3 = 0;
  if (uVar1 == 0) {
    pTVar2 = (TileNode *)0x0;
  }
  else {
    pTVar2 = path->first;
    uVar3 = 0;
  }
  for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    while (__ptr = pTVar2->next, __ptr != (TileNode *)0x0) {
      free(__ptr);
      uVar1 = path->count - 1;
      path->count = uVar1;
      pTVar2 = __ptr;
    }
  }
  free(path);
  return;
}

Assistant:

void destroyPath(struct Path *path) {
    struct TileNode *nextNode = NULL;

    if (path->count > 0)
        nextNode = path->first;

    for (int i = 0; i < path->count; i++) {
        while (nextNode->next != NULL) {
            nextNode = nextNode->next;
            free(nextNode);
            path->count--;
        }
    }
    free(path);
}